

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deorbitalize_func.c
# Opt level: O0

void xc_deorbitalize_func_work
               (xc_func_type *func,size_t np,double *rho,double *sigma,double *lapl,double *tau,
               double *zk,double *vrho,double *vsigma,double *vlapl,double *vtau,double *v2rho2,
               double *v2rhosigma,double *v2rholapl,double *v2rhotau,double *v2sigma2,
               double *v2sigmalapl,double *v2sigmatau,double *v2lapl2,double *v2lapltau,
               double *v2tau2,double *v3rho3,double *v3rho2sigma,double *v3rho2lapl,
               double *v3rho2tau,double *v3rhosigma2,double *v3rhosigmalapl,double *v3rhosigmatau,
               double *v3rholapl2,double *v3rholapltau,double *v3rhotau2,double *v3sigma3,
               double *v3sigma2lapl,double *v3sigma2tau,double *v3sigmalapl2,double *v3sigmalapltau,
               double *v3sigmatau2,double *v3lapl3,double *v3lapl2tau,double *v3lapltau2,
               double *v3tau3,double *v4rho4,double *v4rho3sigma,double *v4rho3lapl,
               double *v4rho3tau,double *v4rho2sigma2,double *v4rho2sigmalapl,double *v4rho2sigmatau
               ,double *v4rho2lapl2,double *v4rho2lapltau,double *v4rho2tau2,double *v4rhosigma3,
               double *v4rhosigma2lapl,double *v4rhosigma2tau,double *v4rhosigmalapl2,
               double *v4rhosigmalapltau,double *v4rhosigmatau2,double *v4rholapl3,
               double *v4rholapl2tau,double *v4rholapltau2,double *v4rhotau3,double *v4sigma4,
               double *v4sigma3lapl,double *v4sigma3tau,double *v4sigma2lapl2,
               double *v4sigma2lapltau,double *v4sigma2tau2,double *v4sigmalapl3,
               double *v4sigmalapl2tau,double *v4sigmalapltau2,double *v4sigmatau3,double *v4lapl4,
               double *v4lapl3tau,double *v4lapl2tau2,double *v4lapltau3,double *v4tau4)

{
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  undefined8 *in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  double *in_stack_00000020;
  double *in_stack_00000030;
  double *in_stack_00000038;
  double *in_stack_00000040;
  double *in_stack_00000050;
  double *in_stack_00000058;
  double *in_stack_00000068;
  long in_stack_00000080;
  double *in_stack_00000120;
  int order;
  size_t ii;
  double *ked2_v4tau4;
  double *ked2_v4lapltau3;
  double *ked2_v4lapl2tau2;
  double *ked2_v4lapl3tau;
  double *ked2_v4lapl4;
  double *ked2_v4sigmatau3;
  double *ked2_v4sigmalapltau2;
  double *ked2_v4sigmalapl2tau;
  double *ked2_v4sigmalapl3;
  double *ked2_v4sigma2tau2;
  double *ked2_v4sigma2lapltau;
  double *ked2_v4sigma2lapl2;
  double *ked2_v4sigma3tau;
  double *ked2_v4sigma3lapl;
  double *ked2_v4sigma4;
  double *ked2_v4rhotau3;
  double *ked2_v4rholapltau2;
  double *ked2_v4rholapl2tau;
  double *ked2_v4rholapl3;
  double *ked2_v4rhosigmatau2;
  double *ked2_v4rhosigmalapltau;
  double *ked2_v4rhosigmalapl2;
  double *ked2_v4rhosigma2tau;
  double *ked2_v4rhosigma2lapl;
  double *ked2_v4rhosigma3;
  double *ked2_v4rho2tau2;
  double *ked2_v4rho2lapltau;
  double *ked2_v4rho2lapl2;
  double *ked2_v4rho2sigmatau;
  double *ked2_v4rho2sigmalapl;
  double *ked2_v4rho2sigma2;
  double *ked2_v4rho3tau;
  double *ked2_v4rho3lapl;
  double *ked2_v4rho3sigma;
  double *ked2_v4rho4;
  double *ked2_v3tau3;
  double *ked2_v3lapltau2;
  double *ked2_v3lapl2tau;
  double *ked2_v3lapl3;
  double *ked2_v3sigmatau2;
  double *ked2_v3sigmalapltau;
  double *ked2_v3sigmalapl2;
  double *ked2_v3sigma2tau;
  double *ked2_v3sigma2lapl;
  double *ked2_v3sigma3;
  double *ked2_v3rhotau2;
  double *ked2_v3rholapltau;
  double *ked2_v3rholapl2;
  double *ked2_v3rhosigmatau;
  double *ked2_v3rhosigmalapl;
  double *ked2_v3rhosigma2;
  double *ked2_v3rho2tau;
  double *ked2_v3rho2lapl;
  double *ked2_v3rho2sigma;
  double *ked2_v3rho3;
  double *ked2_v2tau2;
  double *ked2_v2lapltau;
  double *ked2_v2lapl2;
  double *ked2_v2sigmatau;
  double *ked2_v2sigmalapl;
  double *ked2_v2sigma2;
  double *ked2_v2rhotau;
  double *ked2_v2rholapl;
  double *ked2_v2rhosigma;
  double *ked2_v2rho2;
  double *ked2_vtau;
  double *ked2_vlapl;
  double *ked2_vsigma;
  double *ked2_vrho;
  double *ked2_zk;
  double *ked1_v4tau4;
  double *ked1_v4lapltau3;
  double *ked1_v4lapl2tau2;
  double *ked1_v4lapl3tau;
  double *ked1_v4lapl4;
  double *ked1_v4sigmatau3;
  double *ked1_v4sigmalapltau2;
  double *ked1_v4sigmalapl2tau;
  double *ked1_v4sigmalapl3;
  double *ked1_v4sigma2tau2;
  double *ked1_v4sigma2lapltau;
  double *ked1_v4sigma2lapl2;
  double *ked1_v4sigma3tau;
  double *ked1_v4sigma3lapl;
  double *ked1_v4sigma4;
  double *ked1_v4rhotau3;
  double *ked1_v4rholapltau2;
  double *ked1_v4rholapl2tau;
  double *ked1_v4rholapl3;
  double *ked1_v4rhosigmatau2;
  double *ked1_v4rhosigmalapltau;
  double *ked1_v4rhosigmalapl2;
  double *ked1_v4rhosigma2tau;
  double *ked1_v4rhosigma2lapl;
  double *ked1_v4rhosigma3;
  double *ked1_v4rho2tau2;
  double *ked1_v4rho2lapltau;
  double *ked1_v4rho2lapl2;
  double *ked1_v4rho2sigmatau;
  double *ked1_v4rho2sigmalapl;
  double *ked1_v4rho2sigma2;
  double *ked1_v4rho3tau;
  double *ked1_v4rho3lapl;
  double *ked1_v4rho3sigma;
  double *ked1_v4rho4;
  double *ked1_v3tau3;
  double *ked1_v3lapltau2;
  double *ked1_v3lapl2tau;
  double *ked1_v3lapl3;
  double *ked1_v3sigmatau2;
  double *ked1_v3sigmalapltau;
  double *ked1_v3sigmalapl2;
  double *ked1_v3sigma2tau;
  double *ked1_v3sigma2lapl;
  double *ked1_v3sigma3;
  double *ked1_v3rhotau2;
  double *ked1_v3rholapltau;
  double *ked1_v3rholapl2;
  double *ked1_v3rhosigmatau;
  double *ked1_v3rhosigmalapl;
  double *ked1_v3rhosigma2;
  double *ked1_v3rho2tau;
  double *ked1_v3rho2lapl;
  double *ked1_v3rho2sigma;
  double *ked1_v3rho3;
  double *ked1_v2tau2;
  double *ked1_v2lapltau;
  double *ked1_v2lapl2;
  double *ked1_v2sigmatau;
  double *ked1_v2sigmalapl;
  double *ked1_v2sigma2;
  double *ked1_v2rhotau;
  double *ked1_v2rholapl;
  double *ked1_v2rhosigma;
  double *ked1_v2rho2;
  double *ked1_vtau;
  double *ked1_vlapl;
  double *ked1_vsigma;
  double *ked1_vrho;
  double *ked1_zk;
  double *mgga_v4tau4;
  double *mgga_v4lapltau3;
  double *mgga_v4lapl2tau2;
  double *mgga_v4lapl3tau;
  double *mgga_v4lapl4;
  double *mgga_v4sigmatau3;
  double *mgga_v4sigmalapltau2;
  double *mgga_v4sigmalapl2tau;
  double *mgga_v4sigmalapl3;
  double *mgga_v4sigma2tau2;
  double *mgga_v4sigma2lapltau;
  double *mgga_v4sigma2lapl2;
  double *mgga_v4sigma3tau;
  double *mgga_v4sigma3lapl;
  double *mgga_v4sigma4;
  double *mgga_v4rhotau3;
  double *mgga_v4rholapltau2;
  double *mgga_v4rholapl2tau;
  double *mgga_v4rholapl3;
  double *mgga_v4rhosigmatau2;
  double *mgga_v4rhosigmalapltau;
  double *mgga_v4rhosigmalapl2;
  double *mgga_v4rhosigma2tau;
  double *mgga_v4rhosigma2lapl;
  double *mgga_v4rhosigma3;
  double *mgga_v4rho2tau2;
  double *mgga_v4rho2lapltau;
  double *mgga_v4rho2lapl2;
  double *mgga_v4rho2sigmatau;
  double *mgga_v4rho2sigmalapl;
  double *mgga_v4rho2sigma2;
  double *mgga_v4rho3tau;
  double *mgga_v4rho3lapl;
  double *mgga_v4rho3sigma;
  double *mgga_v4rho4;
  double *mgga_v3tau3;
  double *mgga_v3lapltau2;
  double *mgga_v3lapl2tau;
  double *mgga_v3lapl3;
  double *mgga_v3sigmatau2;
  double *mgga_v3sigmalapltau;
  double *mgga_v3sigmalapl2;
  double *mgga_v3sigma2tau;
  double *mgga_v3sigma2lapl;
  double *mgga_v3sigma3;
  double *mgga_v3rhotau2;
  double *mgga_v3rholapltau;
  double *mgga_v3rholapl2;
  double *mgga_v3rhosigmatau;
  double *mgga_v3rhosigmalapl;
  double *mgga_v3rhosigma2;
  double *mgga_v3rho2tau;
  double *mgga_v3rho2lapl;
  double *mgga_v3rho2sigma;
  double *mgga_v3rho3;
  double *mgga_v2tau2;
  double *mgga_v2lapltau;
  double *mgga_v2lapl2;
  double *mgga_v2sigmatau;
  double *mgga_v2sigmalapl;
  double *mgga_v2sigma2;
  double *mgga_v2rhotau;
  double *mgga_v2rholapl;
  double *mgga_v2rhosigma;
  double *mgga_v2rho2;
  double *mgga_vtau;
  double *mgga_vlapl;
  double *mgga_vsigma;
  double *mgga_vrho;
  double *mgga_zk;
  double *null;
  double *mtau;
  double *mlapl;
  double *msigma;
  double *mrho;
  undefined8 in_stack_ffffffffffffd658;
  int do_zk;
  undefined8 in_stack_ffffffffffffd660;
  xc_dimensions *pxVar1;
  undefined4 uVar2;
  double **ppdVar3;
  double **ppdVar4;
  double **ppdVar5;
  double **ppdVar6;
  double **ppdVar7;
  double **ppdVar8;
  double **ppdVar9;
  double **v4sigmatau3_00;
  double **in_stack_ffffffffffffd898;
  double **in_stack_ffffffffffffd8a0;
  double **in_stack_ffffffffffffd8a8;
  double **in_stack_ffffffffffffd8b0;
  double **in_stack_ffffffffffffd8b8;
  double **in_stack_ffffffffffffd8c0;
  double **in_stack_ffffffffffffd8c8;
  double **in_stack_ffffffffffffd8d0;
  double **in_stack_ffffffffffffd8d8;
  double **in_stack_ffffffffffffd8e0;
  double **in_stack_ffffffffffffd8e8;
  double **in_stack_ffffffffffffd8f0;
  double **in_stack_ffffffffffffd8f8;
  double **in_stack_ffffffffffffd900;
  double **in_stack_ffffffffffffd908;
  double **in_stack_ffffffffffffd910;
  double **in_stack_ffffffffffffd918;
  double **in_stack_ffffffffffffd920;
  double **in_stack_ffffffffffffd928;
  double **in_stack_ffffffffffffd930;
  double **in_stack_ffffffffffffd938;
  double **in_stack_ffffffffffffd940;
  double **in_stack_ffffffffffffd948;
  double **in_stack_ffffffffffffd950;
  double **in_stack_ffffffffffffd958;
  double **in_stack_ffffffffffffd960;
  double **in_stack_ffffffffffffd968;
  double **in_stack_ffffffffffffd970;
  double **in_stack_ffffffffffffd978;
  double **in_stack_ffffffffffffd980;
  double *in_stack_ffffffffffffdaa8;
  double *in_stack_ffffffffffffdab0;
  double *in_stack_ffffffffffffdab8;
  double *in_stack_ffffffffffffdac0;
  size_t in_stack_ffffffffffffdac8;
  xc_func_type *in_stack_ffffffffffffdad0;
  double *in_stack_ffffffffffffdb10;
  double *in_stack_ffffffffffffdb18;
  double *in_stack_ffffffffffffdb20;
  double *in_stack_ffffffffffffdb28;
  double *in_stack_ffffffffffffdb30;
  double *in_stack_ffffffffffffdb38;
  double *in_stack_ffffffffffffdb40;
  double *in_stack_ffffffffffffdb48;
  double *in_stack_ffffffffffffdb50;
  double *in_stack_ffffffffffffdb58;
  double *in_stack_ffffffffffffdb60;
  double *in_stack_ffffffffffffdb68;
  double *in_stack_ffffffffffffdb70;
  double *in_stack_ffffffffffffdb78;
  double *in_stack_ffffffffffffdb80;
  double *in_stack_ffffffffffffdb88;
  double *in_stack_ffffffffffffdb90;
  double *in_stack_ffffffffffffdb98;
  double *in_stack_ffffffffffffdba0;
  double *in_stack_ffffffffffffdba8;
  double *in_stack_ffffffffffffdbb0;
  double *in_stack_ffffffffffffdbb8;
  double *in_stack_ffffffffffffdbc0;
  double *in_stack_ffffffffffffdbc8;
  double *in_stack_ffffffffffffdbd0;
  double *in_stack_ffffffffffffdbd8;
  double *in_stack_ffffffffffffdbe0;
  double *in_stack_ffffffffffffdbe8;
  double *in_stack_ffffffffffffdbf0;
  double *in_stack_ffffffffffffdbf8;
  double *in_stack_ffffffffffffdc00;
  double *in_stack_ffffffffffffdc08;
  double *in_stack_ffffffffffffdc10;
  double *in_stack_ffffffffffffdc18;
  double *in_stack_ffffffffffffdc20;
  double *in_stack_ffffffffffffdc28;
  double *in_stack_ffffffffffffdc30;
  double *in_stack_ffffffffffffdc38;
  double *in_stack_ffffffffffffdc40;
  double *in_stack_ffffffffffffdc48;
  double *in_stack_ffffffffffffdc50;
  double *in_stack_ffffffffffffdc58;
  double *in_stack_ffffffffffffdc60;
  double *in_stack_ffffffffffffdc68;
  double *in_stack_ffffffffffffdc70;
  double *in_stack_ffffffffffffdc78;
  double *in_stack_ffffffffffffdc80;
  double *in_stack_ffffffffffffdc88;
  double *in_stack_ffffffffffffdc90;
  double *in_stack_ffffffffffffdc98;
  double *in_stack_ffffffffffffdca0;
  double *in_stack_ffffffffffffdca8;
  double *in_stack_ffffffffffffdcb0;
  double *in_stack_ffffffffffffdcb8;
  double *in_stack_ffffffffffffdcc0;
  double *in_stack_ffffffffffffdcc8;
  double *in_stack_ffffffffffffdcd0;
  double *in_stack_ffffffffffffdcd8;
  double *in_stack_ffffffffffffdce0;
  double *in_stack_ffffffffffffdce8;
  double *in_stack_ffffffffffffdcf0;
  double *in_stack_ffffffffffffdcf8;
  double *in_stack_ffffffffffffdd00;
  double *in_stack_ffffffffffffdd08;
  double *in_stack_ffffffffffffdd10;
  double *in_stack_ffffffffffffdd18;
  double *in_stack_ffffffffffffdd20;
  double *in_stack_ffffffffffffdd28;
  double *in_stack_ffffffffffffdd30;
  double *in_stack_ffffffffffffdd38;
  int local_724;
  ulong local_720;
  double *local_718;
  double *local_710;
  double *local_708;
  double *local_700;
  double *local_6f8;
  double *local_6f0;
  double *local_6e8;
  double *local_6e0;
  double *local_6d8;
  double *local_6d0;
  double *local_6c8;
  double *local_6c0;
  double *local_6b8;
  double *local_6b0;
  double *local_6a8;
  double *local_6a0;
  double *local_698;
  double *local_690;
  double *local_688;
  double *local_680;
  double *local_678;
  double *local_670;
  double *local_668;
  double *local_660;
  double *local_658;
  double *local_650;
  double *local_648;
  double *local_640;
  double *local_638;
  double *local_630;
  double *local_628;
  double *local_620;
  double *local_618;
  double *local_610;
  double *local_608;
  double *local_600;
  double *local_5f8;
  double *local_5f0;
  double *local_5e8;
  double *local_5e0;
  double *local_5d8;
  double *local_5d0;
  double *local_5c8;
  double *local_5c0;
  double *local_5b8;
  double *local_5b0;
  undefined1 local_5a8 [8];
  undefined1 local_5a0 [8];
  double *local_598;
  double *local_590;
  double *local_588;
  double *local_580;
  double *local_578;
  double *local_570;
  double *local_568;
  double *local_560;
  double *local_558;
  double *local_550;
  double *local_548;
  double *local_540;
  double *local_538;
  double *local_530;
  double *local_528;
  double *local_520;
  double *local_518;
  double *local_510;
  double *local_508;
  double *local_500;
  double *local_4f8;
  double *local_4f0;
  double *local_4e8;
  double *local_4e0;
  double *local_4d8;
  double *local_4d0;
  double *local_4c8;
  double *local_4c0;
  double *local_4b8;
  double *local_4b0;
  double *local_4a8;
  double *local_4a0;
  double *local_498;
  double *local_490;
  double *local_488;
  double *local_480;
  double *local_478;
  double *local_470;
  double *local_468;
  double *local_460;
  double *local_458;
  double *local_450;
  double *local_448;
  double *local_440;
  double *local_438;
  double *local_430;
  double *local_428;
  double *local_420;
  double *local_418;
  double *local_410;
  double *local_408;
  double *local_400;
  double *local_3f8;
  double *local_3f0;
  double *local_3e8;
  double *local_3e0;
  double *local_3d8;
  double *local_3d0;
  double *local_3c8;
  double *local_3c0;
  double *local_3b8;
  double *local_3b0;
  double *local_3a8;
  double *local_3a0;
  double *local_398;
  double *local_390;
  double *local_388;
  double *local_380;
  undefined1 local_378 [8];
  undefined1 local_370 [8];
  double *local_368;
  double *local_360;
  double *local_358;
  double *local_350;
  double *local_348;
  double *local_340;
  double *local_338;
  double *local_330;
  double *local_328;
  double *local_320;
  double *local_318;
  double *local_310;
  double *local_308;
  double *local_300;
  double *local_2f8;
  double *local_2f0;
  double *local_2e8;
  undefined8 local_2e0;
  double *local_2d8;
  double *local_2d0;
  double *local_2c8;
  long local_2c0;
  double *local_2b8;
  double *local_2b0;
  double *local_2a8;
  double *local_2a0;
  double *local_298;
  double *local_290;
  double *local_288;
  double *local_280;
  double *local_278;
  double *local_270;
  double *local_268;
  double *local_260;
  double *local_258;
  double *local_250;
  double *local_248;
  double *local_240;
  double *local_238;
  double *local_230;
  double *local_228;
  double *local_220;
  double *local_218;
  double *local_210;
  double *local_208;
  double *local_200;
  double *local_1f8;
  double *local_1f0;
  double *local_1e8;
  double *local_1e0;
  double *local_1d8;
  double *local_1d0;
  double *local_1c8;
  double *local_1c0;
  double *local_1b8;
  double *local_1b0;
  double *local_1a8;
  double *local_1a0;
  double *local_198;
  double *local_190;
  double *local_188;
  double *local_180;
  double *local_178;
  double *local_170;
  double *local_168;
  double *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  double *local_128;
  double *local_120;
  double *local_118;
  double *local_110;
  double *local_108;
  double *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  double *local_a8;
  double *local_a0;
  double *local_98;
  undefined8 *local_90;
  undefined8 local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  long local_58;
  long local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  local_88._0_4_ = 0;
  local_88._4_4_ = 0;
  local_724 = -1;
  if (in_stack_00000008 != (undefined8 *)0x0) {
    local_724 = 0;
  }
  if (in_stack_00000010 != (double *)0x0) {
    local_724 = 1;
  }
  if (in_stack_00000030 != (double *)0x0) {
    local_724 = 2;
  }
  if (in_stack_00000080 != 0) {
    local_724 = 3;
  }
  if (in_stack_00000120 != (double *)0x0) {
    local_724 = 4;
  }
  if (-1 < local_724) {
    local_2b8 = (double *)0x0;
    local_2b0 = (double *)0x0;
    local_2a8 = (double *)0x0;
    local_2a0 = (double *)0x0;
    local_298 = (double *)0x0;
    local_290 = (double *)0x0;
    local_288 = (double *)0x0;
    local_280 = (double *)0x0;
    local_278 = (double *)0x0;
    local_270 = (double *)0x0;
    local_268 = (double *)0x0;
    local_260 = (double *)0x0;
    local_258 = (double *)0x0;
    local_250 = (double *)0x0;
    local_248 = (double *)0x0;
    local_240 = (double *)0x0;
    local_238 = (double *)0x0;
    local_230 = (double *)0x0;
    local_228 = (double *)0x0;
    local_220 = (double *)0x0;
    local_218 = (double *)0x0;
    local_210 = (double *)0x0;
    local_208 = (double *)0x0;
    local_200 = (double *)0x0;
    local_1f8 = (double *)0x0;
    local_1f0 = (double *)0x0;
    local_1e8 = (double *)0x0;
    local_1e0 = (double *)0x0;
    local_1d8 = (double *)0x0;
    local_1d0 = (double *)0x0;
    local_1c8 = (double *)0x0;
    local_1c0 = (double *)0x0;
    local_1b8 = (double *)0x0;
    local_1b0 = (double *)0x0;
    local_1a8 = (double *)0x0;
    local_1a0 = (double *)0x0;
    local_198 = (double *)0x0;
    local_190 = (double *)0x0;
    local_188 = (double *)0x0;
    local_180 = (double *)0x0;
    local_178 = (double *)0x0;
    local_170 = (double *)0x0;
    local_168 = (double *)0x0;
    local_160 = (double *)0x0;
    local_158 = (double *)0x0;
    local_150 = (double *)0x0;
    local_148 = (double *)0x0;
    local_140 = (double *)0x0;
    local_138 = (double *)0x0;
    local_130 = (double *)0x0;
    local_128 = (double *)0x0;
    local_120 = (double *)0x0;
    local_118 = (double *)0x0;
    local_110 = (double *)0x0;
    local_108 = (double *)0x0;
    local_100 = (double *)0x0;
    local_f8 = (double *)0x0;
    local_f0 = (double *)0x0;
    local_e8 = (double *)0x0;
    local_e0 = (double *)0x0;
    local_d8 = (double *)0x0;
    local_d0 = (double *)0x0;
    local_c8 = (double *)0x0;
    local_c0 = (double *)0x0;
    local_b8 = (double *)0x0;
    local_b0 = (double *)0x0;
    local_a8 = (double *)0x0;
    local_a0 = (double *)0x0;
    local_98 = (double *)0x0;
    local_90 = (undefined8 *)0x0;
    local_4e8 = (double *)0x0;
    local_4e0 = (double *)0x0;
    local_4d8 = (double *)0x0;
    local_4d0 = (double *)0x0;
    local_4c8 = (double *)0x0;
    local_4c0 = (double *)0x0;
    local_4b8 = (double *)0x0;
    local_4b0 = (double *)0x0;
    local_4a8 = (double *)0x0;
    local_4a0 = (double *)0x0;
    local_498 = (double *)0x0;
    local_490 = (double *)0x0;
    local_488 = (double *)0x0;
    local_480 = (double *)0x0;
    local_478 = (double *)0x0;
    local_470 = (double *)0x0;
    local_468 = (double *)0x0;
    local_460 = (double *)0x0;
    local_458 = (double *)0x0;
    local_450 = (double *)0x0;
    local_448 = (double *)0x0;
    local_440 = (double *)0x0;
    local_438 = (double *)0x0;
    local_430 = (double *)0x0;
    local_428 = (double *)0x0;
    local_420 = (double *)0x0;
    local_418 = (double *)0x0;
    local_410 = (double *)0x0;
    local_408 = (double *)0x0;
    local_400 = (double *)0x0;
    local_3f8 = (double *)0x0;
    local_3f0 = (double *)0x0;
    local_3e8 = (double *)0x0;
    local_3e0 = (double *)0x0;
    local_3d8 = (double *)0x0;
    local_3d0 = (double *)0x0;
    local_3c8 = (double *)0x0;
    local_3c0 = (double *)0x0;
    local_3b8 = (double *)0x0;
    local_3b0 = (double *)0x0;
    local_3a8 = (double *)0x0;
    local_3a0 = (double *)0x0;
    local_398 = (double *)0x0;
    local_390 = (double *)0x0;
    local_388 = (double *)0x0;
    local_380 = (double *)0x0;
    local_378 = (undefined1  [8])0x0;
    local_370 = (undefined1  [8])0x0;
    local_368 = (double *)0x0;
    local_360 = (double *)0x0;
    local_358 = (double *)0x0;
    local_350 = (double *)0x0;
    local_348 = (double *)0x0;
    local_340 = (double *)0x0;
    local_338 = (double *)0x0;
    local_330 = (double *)0x0;
    local_328 = (double *)0x0;
    local_320 = (double *)0x0;
    local_318 = (double *)0x0;
    local_310 = (double *)0x0;
    local_308 = (double *)0x0;
    local_300 = (double *)0x0;
    local_2f8 = (double *)0x0;
    local_2f0 = (double *)0x0;
    local_2e8 = (double *)0x0;
    local_2e0._0_4_ = 0;
    local_2e0._4_4_ = 0;
    local_2d8 = (double *)0x0;
    local_2d0 = (double *)0x0;
    local_2c8 = (double *)0x0;
    local_2c0 = 0;
    local_718 = (double *)0x0;
    local_710 = (double *)0x0;
    local_708 = (double *)0x0;
    local_700 = (double *)0x0;
    local_6f8 = (double *)0x0;
    local_6f0 = (double *)0x0;
    local_6e8 = (double *)0x0;
    local_6e0 = (double *)0x0;
    local_6d8 = (double *)0x0;
    local_6d0 = (double *)0x0;
    local_6c8 = (double *)0x0;
    local_6c0 = (double *)0x0;
    local_6b8 = (double *)0x0;
    local_6b0 = (double *)0x0;
    local_6a8 = (double *)0x0;
    local_6a0 = (double *)0x0;
    local_698 = (double *)0x0;
    local_690 = (double *)0x0;
    local_688 = (double *)0x0;
    local_680 = (double *)0x0;
    local_678 = (double *)0x0;
    local_670 = (double *)0x0;
    local_668 = (double *)0x0;
    local_660 = (double *)0x0;
    local_658 = (double *)0x0;
    local_650 = (double *)0x0;
    local_648 = (double *)0x0;
    local_640 = (double *)0x0;
    local_638 = (double *)0x0;
    local_630 = (double *)0x0;
    local_628 = (double *)0x0;
    local_620 = (double *)0x0;
    local_618 = (double *)0x0;
    local_610 = (double *)0x0;
    local_608 = (double *)0x0;
    local_600 = (double *)0x0;
    local_5f8 = (double *)0x0;
    local_5f0 = (double *)0x0;
    local_5e8 = (double *)0x0;
    local_5e0 = (double *)0x0;
    local_5d8 = (double *)0x0;
    local_5d0 = (double *)0x0;
    local_5c8 = (double *)0x0;
    local_5c0 = (double *)0x0;
    local_5b8 = (double *)0x0;
    local_5b0 = (double *)0x0;
    local_5a8 = (undefined1  [8])0x0;
    local_5a0 = (undefined1  [8])0x0;
    local_598 = (double *)0x0;
    local_590 = (double *)0x0;
    local_588 = (double *)0x0;
    local_580 = (double *)0x0;
    local_578 = (double *)0x0;
    local_570 = (double *)0x0;
    local_568 = (double *)0x0;
    local_560 = (double *)0x0;
    local_558 = (double *)0x0;
    local_550 = (double *)0x0;
    local_548 = (double *)0x0;
    local_540 = (double *)0x0;
    local_538 = (double *)0x0;
    local_530 = (double *)0x0;
    local_528 = (double *)0x0;
    local_520 = (double *)0x0;
    local_518 = (double *)0x0;
    local_510 = (double *)0x0;
    local_508 = (double *)0x0;
    local_500 = (double *)0x0;
    local_4f8 = (double *)0x0;
    local_4f0 = (double *)0x0;
    do_zk = (int)((ulong)in_stack_ffffffffffffd658 >> 0x20);
    pxVar1 = (xc_dimensions *)
             CONCAT44((int)((ulong)in_stack_ffffffffffffd660 >> 0x20),(uint)(3 < local_724));
    local_58 = in_R8;
    local_50 = in_RCX;
    local_48 = in_RDX;
    local_40 = in_RSI;
    local_38 = in_RDI;
    xc_mgga_vars_allocate_all
              ((int)((ulong)&local_98 >> 0x20),(size_t)&local_90,pxVar1,do_zk,(uint)(2 < local_724),
               0,(int)&local_a8,(int)&local_b0,&local_b8,&local_c0,&local_c8,&local_d0,&local_d8,
               &local_e0,&local_e8,&local_f0,&local_f8,&local_100,&local_108,&local_110,&local_118,
               &local_120,&local_128,&local_130,&local_138,&local_140,&local_148,&local_150,
               &local_158,&local_160,&local_168,&local_170,&local_178,&local_180,&local_188,
               &local_190,&local_198,&local_1a0,&local_1a8,&local_1b0,&local_1b8,&local_1c0,
               &local_1c8,&local_1d0,&local_1d8,&local_1e0,&local_1e8,&local_1f0,&local_1f8,
               &local_200,&local_208,&local_210,&local_218,&local_220,&local_228,&local_230,
               &local_238,&local_240,&local_248,&local_250,&local_258,&local_260,&local_268,
               &local_270,&local_278,&local_280,&local_288,&local_290,&local_298,&local_2a0,
               &local_2a8,&local_2b0,&local_2b8,in_stack_ffffffffffffd898,in_stack_ffffffffffffd8a0,
               in_stack_ffffffffffffd8a8,in_stack_ffffffffffffd8b0,in_stack_ffffffffffffd8b8);
    ppdVar3 = &local_4e0;
    v4sigmatau3_00 = &local_4e8;
    pxVar1 = (xc_dimensions *)CONCAT44((int)((ulong)pxVar1 >> 0x20),(uint)(3 < local_724));
    xc_mgga_vars_allocate_all
              ((int)((ulong)&local_2c8 >> 0x20),(size_t)&local_2c0,pxVar1,do_zk,
               (uint)(2 < local_724),0,(int)&local_2d8,(int)&local_2e0,&local_2e8,&local_2f0,
               &local_2f8,&local_300,&local_308,&local_310,&local_318,&local_320,&local_328,
               &local_330,&local_338,&local_340,&local_348,&local_350,&local_358,&local_360,
               &local_368,(double **)local_370,(double **)local_378,&local_380,&local_388,&local_390
               ,&local_398,&local_3a0,&local_3a8,&local_3b0,&local_3b8,&local_3c0,&local_3c8,
               &local_3d0,&local_3d8,&local_3e0,&local_3e8,&local_3f0,&local_3f8,&local_400,
               &local_408,&local_410,&local_418,&local_420,&local_428,&local_430,&local_438,
               &local_440,&local_448,&local_450,&local_458,&local_460,&local_468,&local_470,
               &local_478,&local_480,&local_488,&local_490,&local_498,&local_4a0,&local_4a8,
               &local_4b0,&local_4b8,&local_4c0,&local_4c8,&local_4d0,&local_4d8,ppdVar3,
               v4sigmatau3_00,in_stack_ffffffffffffd898,in_stack_ffffffffffffd8a0,
               in_stack_ffffffffffffd8a8,in_stack_ffffffffffffd8b0,in_stack_ffffffffffffd8b8);
    uVar2 = (undefined4)((ulong)pxVar1 >> 0x20);
    if (*(int *)(local_38 + 8) == 1) {
      local_80 = malloc(local_40 << 3);
    }
    else {
      local_68 = malloc(local_40 << 4);
      local_70 = malloc(local_40 * 0x18);
      local_78 = malloc(local_40 << 4);
      local_80 = malloc(local_40 << 4);
      ppdVar3 = &local_710;
      v4sigmatau3_00 = &local_718;
      xc_mgga_vars_allocate_all
                ((int)((ulong)&local_4f8 >> 0x20),(size_t)&local_4f0,
                 (xc_dimensions *)CONCAT44(uVar2,(uint)(3 < local_724)),do_zk,(uint)(2 < local_724),
                 0,(int)&local_508,(int)&local_510,&local_518,&local_520,&local_528,&local_530,
                 &local_538,&local_540,&local_548,&local_550,&local_558,&local_560,&local_568,
                 &local_570,&local_578,&local_580,&local_588,&local_590,&local_598,
                 (double **)local_5a0,(double **)local_5a8,&local_5b0,&local_5b8,&local_5c0,
                 &local_5c8,&local_5d0,&local_5d8,&local_5e0,&local_5e8,&local_5f0,&local_5f8,
                 &local_600,&local_608,&local_610,&local_618,&local_620,&local_628,&local_630,
                 &local_638,&local_640,&local_648,&local_650,&local_658,&local_660,&local_668,
                 &local_670,&local_678,&local_680,&local_688,&local_690,&local_698,&local_6a0,
                 &local_6a8,&local_6b0,&local_6b8,&local_6c0,&local_6c8,&local_6d0,&local_6d8,
                 &local_6e0,&local_6e8,&local_6f0,&local_6f8,&local_700,&local_708,ppdVar3,
                 v4sigmatau3_00,in_stack_ffffffffffffd898,in_stack_ffffffffffffd8a0,
                 in_stack_ffffffffffffd8a8,in_stack_ffffffffffffd8b0,in_stack_ffffffffffffd8b8);
    }
    if (*(int *)(local_38 + 8) == 1) {
      xc_mgga_evaluate_functional
                (in_stack_ffffffffffffdad0,in_stack_ffffffffffffdac8,in_stack_ffffffffffffdac0,
                 in_stack_ffffffffffffdab8,in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaa8,
                 in_stack_ffffffffffffdb10,in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb20,
                 in_stack_ffffffffffffdb28,in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb38,
                 in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb50,
                 in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb68,
                 in_stack_ffffffffffffdb70,in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb80,
                 in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb98,
                 in_stack_ffffffffffffdba0,in_stack_ffffffffffffdba8,in_stack_ffffffffffffdbb0,
                 in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbc8,
                 in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbe0,
                 in_stack_ffffffffffffdbe8,in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbf8,
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdc08,in_stack_ffffffffffffdc10,
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc28,
                 in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc40,
                 in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc58,
                 in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc68,in_stack_ffffffffffffdc70,
                 in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc88,
                 in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc98,in_stack_ffffffffffffdca0,
                 in_stack_ffffffffffffdca8,in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcb8,
                 in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcc8,in_stack_ffffffffffffdcd0,
                 in_stack_ffffffffffffdcd8,in_stack_ffffffffffffdce0,in_stack_ffffffffffffdce8,
                 in_stack_ffffffffffffdcf0,in_stack_ffffffffffffdcf8,in_stack_ffffffffffffdd00,
                 in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd10,in_stack_ffffffffffffdd18,
                 in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd28,in_stack_ffffffffffffdd30,
                 in_stack_ffffffffffffdd38);
    }
    else {
      for (local_720 = 0; local_720 < local_40; local_720 = local_720 + 1) {
        *(undefined8 *)((long)local_68 + local_720 * 0x10) =
             *(undefined8 *)(local_48 + local_720 * 0x10);
        *(undefined8 *)((long)local_68 + local_720 * 0x10 + 8) = 0;
        *(undefined8 *)((long)local_70 + local_720 * 0x18) =
             *(undefined8 *)(local_50 + local_720 * 0x18);
        *(undefined8 *)((long)local_70 + local_720 * 0x18 + 8) = 0;
        *(undefined8 *)((long)local_70 + local_720 * 0x18 + 0x10) = 0;
        *(undefined8 *)((long)local_78 + local_720 * 0x10) =
             *(undefined8 *)(local_58 + local_720 * 0x10);
        *(undefined8 *)((long)local_78 + local_720 * 0x10 + 8) = 0;
      }
      xc_mgga_evaluate_functional
                (in_stack_ffffffffffffdad0,in_stack_ffffffffffffdac8,in_stack_ffffffffffffdac0,
                 in_stack_ffffffffffffdab8,in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaa8,
                 in_stack_ffffffffffffdb10,in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb20,
                 in_stack_ffffffffffffdb28,in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb38,
                 in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb50,
                 in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb68,
                 in_stack_ffffffffffffdb70,in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb80,
                 in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb98,
                 in_stack_ffffffffffffdba0,in_stack_ffffffffffffdba8,in_stack_ffffffffffffdbb0,
                 in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbc8,
                 in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbe0,
                 in_stack_ffffffffffffdbe8,in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbf8,
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdc08,in_stack_ffffffffffffdc10,
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc28,
                 in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc40,
                 in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc58,
                 in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc68,in_stack_ffffffffffffdc70,
                 in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc88,
                 in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc98,in_stack_ffffffffffffdca0,
                 in_stack_ffffffffffffdca8,in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcb8,
                 in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcc8,in_stack_ffffffffffffdcd0,
                 in_stack_ffffffffffffdcd8,in_stack_ffffffffffffdce0,in_stack_ffffffffffffdce8,
                 in_stack_ffffffffffffdcf0,in_stack_ffffffffffffdcf8,in_stack_ffffffffffffdd00,
                 in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd10,in_stack_ffffffffffffdd18,
                 in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd28,in_stack_ffffffffffffdd30,
                 in_stack_ffffffffffffdd38);
      for (local_720 = 0; local_720 < local_40; local_720 = local_720 + 1) {
        *(undefined8 *)((long)local_68 + local_720 * 0x10) =
             *(undefined8 *)(local_48 + 8 + local_720 * 0x10);
        *(undefined8 *)((long)local_70 + local_720 * 0x18) =
             *(undefined8 *)(local_50 + 0x10 + local_720 * 0x18);
        *(undefined8 *)((long)local_78 + local_720 * 0x10) =
             *(undefined8 *)(local_58 + 8 + local_720 * 0x10);
      }
      xc_mgga_evaluate_functional
                (in_stack_ffffffffffffdad0,in_stack_ffffffffffffdac8,in_stack_ffffffffffffdac0,
                 in_stack_ffffffffffffdab8,in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaa8,
                 in_stack_ffffffffffffdb10,in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb20,
                 in_stack_ffffffffffffdb28,in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb38,
                 in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb50,
                 in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb68,
                 in_stack_ffffffffffffdb70,in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb80,
                 in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb98,
                 in_stack_ffffffffffffdba0,in_stack_ffffffffffffdba8,in_stack_ffffffffffffdbb0,
                 in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbc8,
                 in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbe0,
                 in_stack_ffffffffffffdbe8,in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbf8,
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdc08,in_stack_ffffffffffffdc10,
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc28,
                 in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc40,
                 in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc58,
                 in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc68,in_stack_ffffffffffffdc70,
                 in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc88,
                 in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc98,in_stack_ffffffffffffdca0,
                 in_stack_ffffffffffffdca8,in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcb8,
                 in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcc8,in_stack_ffffffffffffdcd0,
                 in_stack_ffffffffffffdcd8,in_stack_ffffffffffffdce0,in_stack_ffffffffffffdce8,
                 in_stack_ffffffffffffdcf0,in_stack_ffffffffffffdcf8,in_stack_ffffffffffffdd00,
                 in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd10,in_stack_ffffffffffffdd18,
                 in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd28,in_stack_ffffffffffffdd30,
                 in_stack_ffffffffffffdd38);
    }
    if (*(int *)(local_38 + 8) == 1) {
      for (local_720 = 0; local_720 < local_40; local_720 = local_720 + 1) {
        *(double *)((long)local_80 + local_720 * 8) =
             *(double *)(local_48 + local_720 * 8) * *(double *)(local_2c0 + local_720 * 8);
      }
    }
    else {
      for (local_720 = 0; local_720 < local_40; local_720 = local_720 + 1) {
        *(double *)((long)local_80 + local_720 * 0x10) =
             *(double *)(local_48 + local_720 * 0x10) * *(double *)(local_2c0 + local_720 * 8);
        *(double *)((long)local_80 + local_720 * 0x10 + 8) =
             *(double *)(local_48 + 8 + local_720 * 0x10) * local_4f0[local_720];
      }
    }
    xc_mgga_evaluate_functional
              (in_stack_ffffffffffffdad0,in_stack_ffffffffffffdac8,in_stack_ffffffffffffdac0,
               in_stack_ffffffffffffdab8,in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaa8,
               in_stack_ffffffffffffdb10,in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb20,
               in_stack_ffffffffffffdb28,in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb38,
               in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb50,
               in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb68,
               in_stack_ffffffffffffdb70,in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb80,
               in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdba0,in_stack_ffffffffffffdba8,in_stack_ffffffffffffdbb0,
               in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbc8,
               in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbe0,
               in_stack_ffffffffffffdbe8,in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbf8,
               in_stack_ffffffffffffdc00,in_stack_ffffffffffffdc08,in_stack_ffffffffffffdc10,
               in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc28,
               in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc40,
               in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc58,
               in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc68,in_stack_ffffffffffffdc70,
               in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc88,
               in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc98,in_stack_ffffffffffffdca0,
               in_stack_ffffffffffffdca8,in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcb8,
               in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcc8,in_stack_ffffffffffffdcd0,
               in_stack_ffffffffffffdcd8,in_stack_ffffffffffffdce0,in_stack_ffffffffffffdce8,
               in_stack_ffffffffffffdcf0,in_stack_ffffffffffffdcf8,in_stack_ffffffffffffdd00,
               in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd10,in_stack_ffffffffffffdd18,
               in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd28,in_stack_ffffffffffffdd30,
               in_stack_ffffffffffffdd38);
    for (local_720 = 0; local_720 < local_40; local_720 = local_720 + 1) {
      if (in_stack_00000008 != (undefined8 *)0x0) {
        *in_stack_00000008 = *local_90;
      }
      if (in_stack_00000010 != (double *)0x0) {
        *in_stack_00000010 = *local_2c8 * *local_b0 + *local_98;
        *in_stack_00000018 = *local_2d0 * *local_b0 + *local_a0;
        *in_stack_00000020 = *local_2d8 * *local_b0 + *local_a8;
        if (*(int *)(local_38 + 8) == 2) {
          in_stack_00000010[1] = *local_4f8 * local_b0[1] + local_98[1];
          in_stack_00000018[1] = local_a0[1];
          in_stack_00000018[2] = *local_500 * local_b0[1] + local_a0[2];
          in_stack_00000020[1] = *local_508 * local_b0[1] + local_a8[1];
        }
      }
      if (in_stack_00000030 != (double *)0x0) {
        *in_stack_00000030 =
             *local_2c8 * 2.0 * *local_d0 +
             *local_2e8 * *local_b0 + *local_2c8 * *local_2c8 * *local_100 + *local_b8;
        *in_stack_00000038 =
             *local_2d0 * (*local_2c8 * *local_100 + *local_d0) +
             *local_2f0 * *local_b0 + *local_2c8 * *local_e8 + *local_c0;
        *in_stack_00000040 =
             *local_2d8 * (*local_2c8 * *local_100 + *local_d0) +
             *local_2f8 * *local_b0 + *local_2c8 * *local_f8 + *local_c8;
        *in_stack_00000050 =
             *local_2d0 * 2.0 * *local_e8 +
             *local_308 * *local_b0 + *local_2d0 * *local_2d0 * *local_100 + *local_d8;
        *in_stack_00000058 =
             *local_2d8 * (*local_2d0 * *local_100 + *local_e8) +
             *local_310 * *local_b0 + *local_2d0 * *local_f8 + *local_e0;
        *in_stack_00000068 =
             *local_2d8 * 2.0 * *local_f8 +
             *local_320 * *local_b0 + *local_2d8 * *local_2d8 * *local_100 + *local_f0;
        if (*(int *)(local_38 + 8) == 2) {
          in_stack_00000030[1] =
               *local_2c8 * (*local_4f8 * local_100[1] + local_d0[2]) + *local_4f8 * local_d0[1] +
               local_b8[1];
          in_stack_00000030[2] =
               *local_4f8 * 2.0 * local_d0[3] +
               *local_518 * local_b0[1] + *local_4f8 * *local_4f8 * local_100[2] + local_b8[2];
          in_stack_00000038[1] = *local_2c8 * local_e8[2] + local_c0[1];
          in_stack_00000038[2] =
               *local_2c8 * local_e8[4] + *local_500 * (*local_2c8 * local_100[1] + local_d0[1]) +
               local_c0[2];
          in_stack_00000038[3] =
               *local_4f8 * local_e8[1] + *local_2d0 * (*local_4f8 * local_100[1] + local_d0[2]) +
               local_c0[3];
          in_stack_00000038[4] = *local_4f8 * local_e8[3] + local_c0[4];
          in_stack_00000038[5] =
               *local_500 * (*local_4f8 * local_100[2] + local_d0[3]) +
               *local_520 * local_b0[1] + *local_4f8 * local_e8[5] + local_c0[5];
          in_stack_00000040[1] =
               *local_2c8 * local_f8[2] + *local_508 * (*local_2c8 * local_100[1] + local_d0[1]) +
               local_c8[1];
          in_stack_00000040[2] =
               *local_4f8 * local_f8[1] + *local_2d8 * (*local_4f8 * local_100[1] + local_d0[2]) +
               local_c8[2];
          in_stack_00000040[3] =
               *local_508 * (*local_4f8 * local_100[2] + local_d0[3]) +
               *local_528 * local_b0[1] + *local_4f8 * local_f8[3] + local_c8[3];
          in_stack_00000050[1] = *local_2d0 * local_e8[2] + local_d8[1];
          in_stack_00000050[2] =
               *local_2d0 * (*local_500 * local_100[1] + local_e8[4]) + *local_500 * local_e8[1] +
               local_d8[2];
          in_stack_00000050[3] = local_d8[3];
          in_stack_00000050[4] = *local_500 * local_e8[3] + local_d8[4];
          in_stack_00000050[5] =
               *local_500 * 2.0 * local_e8[5] +
               *local_538 * local_b0[1] + *local_500 * *local_500 * local_100[2] + local_d8[5];
          in_stack_00000058[1] =
               *local_2d0 * local_f8[2] + *local_508 * (*local_2d0 * local_100[1] + local_e8[1]) +
               local_e0[1];
          in_stack_00000058[2] = *local_2d8 * local_e8[2] + local_e0[2];
          in_stack_00000058[3] = *local_508 * local_e8[3] + local_e0[3];
          in_stack_00000058[4] =
               *local_500 * local_f8[1] + *local_2d8 * (*local_500 * local_100[1] + local_e8[4]) +
               local_e0[4];
          in_stack_00000058[5] =
               *local_508 * (*local_500 * local_100[2] + local_e8[5]) +
               *local_540 * local_b0[1] + *local_500 * local_f8[3] + local_e0[5];
          in_stack_00000068[1] =
               *local_2d8 * (*local_508 * local_100[1] + local_f8[2]) + *local_508 * local_f8[1] +
               local_f0[1];
          in_stack_00000068[2] =
               *local_508 * 2.0 * local_f8[3] +
               *local_550 * local_b0[1] + *local_508 * *local_508 * local_100[2] + local_f0[2];
        }
      }
      internal_counters_mgga_next
                ((xc_dimensions *)&stack0x000000c0,(int)((ulong)&stack0x000000b8 >> 0x20),
                 (double **)&stack0x000000b0,(double **)&stack0x000000a8,(double **)&stack0x000000a0
                 ,(double **)&stack0x00000098,(double **)&stack0x00000100,
                 (double **)&stack0x00000108,(double **)&stack0x00000110,(double **)&stack0x00000118
                 ,&stack0x00000120,(double **)&stack0x00000128,(double **)&stack0x00000130,
                 (double **)&stack0x00000138,(double **)&stack0x00000140,(double **)&stack0x00000148
                 ,(double **)&stack0x00000150,(double **)&stack0x00000158,
                 (double **)&stack0x00000160,(double **)&stack0x00000168,(double **)&stack0x00000170
                 ,(double **)&stack0x00000178,(double **)&stack0x00000180,
                 (double **)&stack0x00000188,(double **)&stack0x00000190,(double **)&stack0x00000198
                 ,(double **)&stack0x000001a0,(double **)&stack0x000001a8,
                 (double **)&stack0x000001b0,(double **)&stack0x000001b8,(double **)&stack0x000001c0
                 ,(double **)&stack0x000001c8,(double **)&stack0x000001d0,
                 (double **)&stack0x000001d8,(double **)&stack0x000001e0,(double **)&stack0x000001e8
                 ,(double **)&stack0x000001f0,(double **)&stack0x000001f8,
                 (double **)&stack0x00000200,(double **)&stack0x00000208,(double **)&stack0x00000210
                 ,(double **)&stack0x00000218,(double **)&stack0x00000220,
                 (double **)&stack0x00000228,(double **)&stack0x00000230,ppdVar3,v4sigmatau3_00,
                 in_stack_ffffffffffffd898,in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd8a8,
                 in_stack_ffffffffffffd8b0,in_stack_ffffffffffffd8b8,in_stack_ffffffffffffd8c0,
                 in_stack_ffffffffffffd8c8,in_stack_ffffffffffffd8d0,in_stack_ffffffffffffd8d8,
                 in_stack_ffffffffffffd8e0,in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8f0,
                 in_stack_ffffffffffffd8f8,in_stack_ffffffffffffd900,in_stack_ffffffffffffd908,
                 in_stack_ffffffffffffd910,in_stack_ffffffffffffd918,in_stack_ffffffffffffd920,
                 in_stack_ffffffffffffd928,in_stack_ffffffffffffd930,in_stack_ffffffffffffd938,
                 in_stack_ffffffffffffd940,in_stack_ffffffffffffd948,in_stack_ffffffffffffd950,
                 in_stack_ffffffffffffd958,in_stack_ffffffffffffd960,in_stack_ffffffffffffd968,
                 in_stack_ffffffffffffd970,in_stack_ffffffffffffd978);
      internal_counters_mgga_next
                ((xc_dimensions *)&local_148,(int)((ulong)&local_140 >> 0x20),&local_138,&local_130,
                 &local_128,&local_120,&local_188,&local_190,&local_198,&local_1a0,&local_1a8,
                 &local_1b0,&local_1b8,&local_1c0,&local_1c8,&local_1d0,&local_1d8,&local_1e0,
                 &local_1e8,&local_1f0,&local_1f8,&local_200,&local_208,&local_210,&local_218,
                 &local_220,&local_228,&local_230,&local_238,&local_240,&local_248,&local_250,
                 &local_258,&local_260,&local_268,&local_270,&local_278,&local_280,&local_288,
                 &local_290,&local_298,&local_2a0,&local_2a8,&local_2b0,&local_2b8,ppdVar3,
                 v4sigmatau3_00,in_stack_ffffffffffffd898,in_stack_ffffffffffffd8a0,
                 in_stack_ffffffffffffd8a8,in_stack_ffffffffffffd8b0,in_stack_ffffffffffffd8b8,
                 in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8c8,in_stack_ffffffffffffd8d0,
                 in_stack_ffffffffffffd8d8,in_stack_ffffffffffffd8e0,in_stack_ffffffffffffd8e8,
                 in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8f8,in_stack_ffffffffffffd900,
                 in_stack_ffffffffffffd908,in_stack_ffffffffffffd910,in_stack_ffffffffffffd918,
                 in_stack_ffffffffffffd920,in_stack_ffffffffffffd928,in_stack_ffffffffffffd930,
                 in_stack_ffffffffffffd938,in_stack_ffffffffffffd940,in_stack_ffffffffffffd948,
                 in_stack_ffffffffffffd950,in_stack_ffffffffffffd958,in_stack_ffffffffffffd960,
                 in_stack_ffffffffffffd968,in_stack_ffffffffffffd970,in_stack_ffffffffffffd978);
      internal_counters_mgga_next
                ((xc_dimensions *)local_378,(int)((ulong)local_370 >> 0x20),&local_368,&local_360,
                 &local_358,&local_350,&local_3b8,&local_3c0,&local_3c8,&local_3d0,&local_3d8,
                 &local_3e0,&local_3e8,&local_3f0,&local_3f8,&local_400,&local_408,&local_410,
                 &local_418,&local_420,&local_428,&local_430,&local_438,&local_440,&local_448,
                 &local_450,&local_458,&local_460,&local_468,&local_470,&local_478,&local_480,
                 &local_488,&local_490,&local_498,&local_4a0,&local_4a8,&local_4b0,&local_4b8,
                 &local_4c0,&local_4c8,&local_4d0,&local_4d8,&local_4e0,&local_4e8,ppdVar3,
                 v4sigmatau3_00,in_stack_ffffffffffffd898,in_stack_ffffffffffffd8a0,
                 in_stack_ffffffffffffd8a8,in_stack_ffffffffffffd8b0,in_stack_ffffffffffffd8b8,
                 in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8c8,in_stack_ffffffffffffd8d0,
                 in_stack_ffffffffffffd8d8,in_stack_ffffffffffffd8e0,in_stack_ffffffffffffd8e8,
                 in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8f8,in_stack_ffffffffffffd900,
                 in_stack_ffffffffffffd908,in_stack_ffffffffffffd910,in_stack_ffffffffffffd918,
                 in_stack_ffffffffffffd920,in_stack_ffffffffffffd928,in_stack_ffffffffffffd930,
                 in_stack_ffffffffffffd938,in_stack_ffffffffffffd940,in_stack_ffffffffffffd948,
                 in_stack_ffffffffffffd950,in_stack_ffffffffffffd958,in_stack_ffffffffffffd960,
                 in_stack_ffffffffffffd968,in_stack_ffffffffffffd970,in_stack_ffffffffffffd978);
      if (*(int *)(local_38 + 8) == 2) {
        internal_counters_mgga_next
                  ((xc_dimensions *)local_5a8,(int)((ulong)local_5a0 >> 0x20),&local_598,&local_590,
                   &local_588,&local_580,&local_5e8,&local_5f0,&local_5f8,&local_600,&local_608,
                   &local_610,&local_618,&local_620,&local_628,&local_630,&local_638,&local_640,
                   &local_648,&local_650,&local_658,&local_660,&local_668,&local_670,&local_678,
                   &local_680,&local_688,&local_690,&local_698,&local_6a0,&local_6a8,&local_6b0,
                   &local_6b8,&local_6c0,&local_6c8,&local_6d0,&local_6d8,&local_6e0,&local_6e8,
                   &local_6f0,&local_6f8,&local_700,&local_708,&local_710,&local_718,ppdVar3,
                   v4sigmatau3_00,in_stack_ffffffffffffd898,in_stack_ffffffffffffd8a0,
                   in_stack_ffffffffffffd8a8,in_stack_ffffffffffffd8b0,in_stack_ffffffffffffd8b8,
                   in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8c8,in_stack_ffffffffffffd8d0,
                   in_stack_ffffffffffffd8d8,in_stack_ffffffffffffd8e0,in_stack_ffffffffffffd8e8,
                   in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8f8,in_stack_ffffffffffffd900,
                   in_stack_ffffffffffffd908,in_stack_ffffffffffffd910,in_stack_ffffffffffffd918,
                   in_stack_ffffffffffffd920,in_stack_ffffffffffffd928,in_stack_ffffffffffffd930,
                   in_stack_ffffffffffffd938,in_stack_ffffffffffffd940,in_stack_ffffffffffffd948,
                   in_stack_ffffffffffffd950,in_stack_ffffffffffffd958,in_stack_ffffffffffffd960,
                   in_stack_ffffffffffffd968,in_stack_ffffffffffffd970,in_stack_ffffffffffffd978);
      }
    }
    ppdVar3 = &local_288;
    ppdVar4 = &local_290;
    ppdVar5 = &local_298;
    ppdVar6 = &local_2a0;
    ppdVar7 = &local_2a8;
    ppdVar8 = &local_2b0;
    ppdVar9 = &local_2b8;
    internal_counters_mgga_random
              ((xc_dimensions *)&local_140,(int)((ulong)&local_138 >> 0x20),(int)&local_138,
               &local_130,&local_128,&local_120,&local_180,&local_188,&local_190,&local_198,
               &local_1a0,&local_1a8,&local_1b0,&local_1b8,&local_1c0,&local_1c8,&local_1d0,
               &local_1d8,&local_1e0,&local_1e8,&local_1f0,&local_1f8,&local_200,&local_208,
               &local_210,&local_218,&local_220,&local_228,&local_230,&local_238,&local_240,
               &local_248,&local_250,&local_258,&local_260,&local_268,&local_270,&local_278,
               &local_280,ppdVar3,ppdVar4,ppdVar5,ppdVar6,ppdVar7,ppdVar8,ppdVar9,v4sigmatau3_00,
               in_stack_ffffffffffffd898,in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd8a8,
               in_stack_ffffffffffffd8b0,in_stack_ffffffffffffd8b8,in_stack_ffffffffffffd8c0,
               in_stack_ffffffffffffd8c8,in_stack_ffffffffffffd8d0,in_stack_ffffffffffffd8d8,
               in_stack_ffffffffffffd8e0,in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8f0,
               in_stack_ffffffffffffd8f8,in_stack_ffffffffffffd900,in_stack_ffffffffffffd908,
               in_stack_ffffffffffffd910,in_stack_ffffffffffffd918,in_stack_ffffffffffffd920,
               in_stack_ffffffffffffd928,in_stack_ffffffffffffd930,in_stack_ffffffffffffd938,
               in_stack_ffffffffffffd940,in_stack_ffffffffffffd948,in_stack_ffffffffffffd950,
               in_stack_ffffffffffffd958,in_stack_ffffffffffffd960,in_stack_ffffffffffffd968,
               in_stack_ffffffffffffd970,in_stack_ffffffffffffd978,in_stack_ffffffffffffd980);
    xc_mgga_vars_free_all
              (local_e8,local_e0,local_d8,local_d0,local_c8,local_c0,local_f8,local_100,local_108,
               local_110,local_118,local_120,local_128,local_130,local_138,local_140,local_148,
               local_150,local_158,local_160,local_168,local_170,local_178,local_180,local_188,
               local_190,local_198,local_1a0,local_1a8,local_1b0,local_1b8,local_1c0,local_1c8,
               local_1d0,local_1d8,local_1e0,local_1e8,local_1f0,local_1f8,local_200,local_208,
               local_210,local_218,local_220,local_228,local_230,local_238,local_240,local_248,
               local_250,local_258,local_260,local_268,local_270,local_278,local_280,local_288,
               local_290,local_298,local_2a0,local_2a8,local_2b0,local_2b8,(double *)ppdVar3,
               (double *)ppdVar4,(double *)ppdVar5,(double *)ppdVar6,(double *)ppdVar7,
               (double *)ppdVar8,(double *)ppdVar9);
    ppdVar3 = &local_4b8;
    ppdVar4 = &local_4c0;
    ppdVar5 = &local_4c8;
    ppdVar6 = &local_4d0;
    ppdVar7 = &local_4d8;
    ppdVar8 = &local_4e0;
    ppdVar9 = &local_4e8;
    internal_counters_mgga_random
              ((xc_dimensions *)local_370,(int)((ulong)&local_368 >> 0x20),(int)&local_368,
               &local_360,&local_358,&local_350,&local_3b0,&local_3b8,&local_3c0,&local_3c8,
               &local_3d0,&local_3d8,&local_3e0,&local_3e8,&local_3f0,&local_3f8,&local_400,
               &local_408,&local_410,&local_418,&local_420,&local_428,&local_430,&local_438,
               &local_440,&local_448,&local_450,&local_458,&local_460,&local_468,&local_470,
               &local_478,&local_480,&local_488,&local_490,&local_498,&local_4a0,&local_4a8,
               &local_4b0,ppdVar3,ppdVar4,ppdVar5,ppdVar6,ppdVar7,ppdVar8,ppdVar9,v4sigmatau3_00,
               in_stack_ffffffffffffd898,in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd8a8,
               in_stack_ffffffffffffd8b0,in_stack_ffffffffffffd8b8,in_stack_ffffffffffffd8c0,
               in_stack_ffffffffffffd8c8,in_stack_ffffffffffffd8d0,in_stack_ffffffffffffd8d8,
               in_stack_ffffffffffffd8e0,in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8f0,
               in_stack_ffffffffffffd8f8,in_stack_ffffffffffffd900,in_stack_ffffffffffffd908,
               in_stack_ffffffffffffd910,in_stack_ffffffffffffd918,in_stack_ffffffffffffd920,
               in_stack_ffffffffffffd928,in_stack_ffffffffffffd930,in_stack_ffffffffffffd938,
               in_stack_ffffffffffffd940,in_stack_ffffffffffffd948,in_stack_ffffffffffffd950,
               in_stack_ffffffffffffd958,in_stack_ffffffffffffd960,in_stack_ffffffffffffd968,
               in_stack_ffffffffffffd970,in_stack_ffffffffffffd978,in_stack_ffffffffffffd980);
    xc_mgga_vars_free_all
              (local_318,local_310,local_308,local_300,local_2f8,local_2f0,local_328,local_330,
               local_338,local_340,local_348,local_350,local_358,local_360,local_368,
               (double *)local_370,(double *)local_378,local_380,local_388,local_390,local_398,
               local_3a0,local_3a8,local_3b0,local_3b8,local_3c0,local_3c8,local_3d0,local_3d8,
               local_3e0,local_3e8,local_3f0,local_3f8,local_400,local_408,local_410,local_418,
               local_420,local_428,local_430,local_438,local_440,local_448,local_450,local_458,
               local_460,local_468,local_470,local_478,local_480,local_488,local_490,local_498,
               local_4a0,local_4a8,local_4b0,local_4b8,local_4c0,local_4c8,local_4d0,local_4d8,
               local_4e0,local_4e8,(double *)ppdVar3,(double *)ppdVar4,(double *)ppdVar5,
               (double *)ppdVar6,(double *)ppdVar7,(double *)ppdVar8,(double *)ppdVar9);
    if (*(int *)(local_38 + 8) == 2) {
      ppdVar3 = &local_6e8;
      ppdVar4 = &local_6f0;
      ppdVar5 = &local_6f8;
      ppdVar6 = &local_700;
      ppdVar7 = &local_708;
      ppdVar8 = &local_710;
      ppdVar9 = &local_718;
      internal_counters_mgga_random
                ((xc_dimensions *)local_5a0,(int)((ulong)&local_598 >> 0x20),(int)&local_598,
                 &local_590,&local_588,&local_580,&local_5e0,&local_5e8,&local_5f0,&local_5f8,
                 &local_600,&local_608,&local_610,&local_618,&local_620,&local_628,&local_630,
                 &local_638,&local_640,&local_648,&local_650,&local_658,&local_660,&local_668,
                 &local_670,&local_678,&local_680,&local_688,&local_690,&local_698,&local_6a0,
                 &local_6a8,&local_6b0,&local_6b8,&local_6c0,&local_6c8,&local_6d0,&local_6d8,
                 &local_6e0,ppdVar3,ppdVar4,ppdVar5,ppdVar6,ppdVar7,ppdVar8,ppdVar9,v4sigmatau3_00,
                 &local_4f0,&local_4f8,&local_500,&local_508,&local_510,&local_518,&local_520,
                 &local_528,&local_530,&local_538,&local_540,&local_548,&local_550,&local_558,
                 &local_560,&local_568,&local_570,&local_578,&local_580,&local_588,&local_590,
                 &local_598,(double **)local_5a0,(double **)local_5a8,&local_5b0,&local_5b8,
                 &local_5c0,&local_5c8,&local_5d0,&local_5d8);
      xc_mgga_vars_free_all
                (local_548,local_540,local_538,local_530,local_528,local_520,local_558,local_560,
                 local_568,local_570,local_578,local_580,local_588,local_590,local_598,
                 (double *)local_5a0,(double *)local_5a8,local_5b0,local_5b8,local_5c0,local_5c8,
                 local_5d0,local_5d8,local_5e0,local_5e8,local_5f0,local_5f8,local_600,local_608,
                 local_610,local_618,local_620,local_628,local_630,local_638,local_640,local_648,
                 local_650,local_658,local_660,local_668,local_670,local_678,local_680,local_688,
                 local_690,local_698,local_6a0,local_6a8,local_6b0,local_6b8,local_6c0,local_6c8,
                 local_6d0,local_6d8,local_6e0,local_6e8,local_6f0,local_6f8,local_700,local_708,
                 local_710,local_718,(double *)ppdVar3,(double *)ppdVar4,(double *)ppdVar5,
                 (double *)ppdVar6,(double *)ppdVar7,(double *)ppdVar8,(double *)ppdVar9);
      free(local_68);
      free(local_70);
      free(local_78);
    }
    free(local_80);
  }
  return;
}

Assistant:

void
xc_deorbitalize_func_work(const xc_func_type *func, size_t np,
                     const double *rho, const double *sigma, const double *lapl, const double *tau,
                     double *zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA double *, ))
{
  double *mrho, *msigma, *mlapl, *mtau;
  const double *null = NULL;
  double *mgga_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA *, mgga_);
  double *ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA *, ked1_);
  double *ked2_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA *, ked2_);
  size_t ii;
  int order = -1;

  if(zk     != NULL) order = 0;
  if(vrho   != NULL) order = 1;
  if(v2rho2 != NULL) order = 2;
  if(v3rho3 != NULL) order = 3;
  if(v4rho4 != NULL) order = 4;

  if(order < 0) return;

  /* prepare buffers that will hold the results from the individual functionals */
  mgga_zk MGGA_OUT_PARAMS_NO_EXC(=, mgga_ ) = NULL;
  ked1_zk MGGA_OUT_PARAMS_NO_EXC(=, ked1_ ) = NULL;
  ked2_zk MGGA_OUT_PARAMS_NO_EXC(=, ked2_ ) = NULL;

  /* allocate buffers */
  xc_mgga_vars_allocate_all(func->func_aux[0]->info->family, np, &(func->func_aux[0]->dim),
                       order >= 0, order >= 1, order >= 2, order >= 3, order >= 4,
                       &mgga_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, mgga_));
  xc_mgga_vars_allocate_all(func->func_aux[1]->info->family, np, &(func->func_aux[1]->dim),
                       order >= 0, order >= 1, order >= 2, order >= 3, order >= 4,
                       &ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ked1_));

  if(func->nspin == XC_UNPOLARIZED){
    mtau   = (double *) libxc_malloc(sizeof(double)*np);
  }else{
    mrho   = (double *) libxc_malloc(2*sizeof(double)*np);
    msigma = (double *) libxc_malloc(3*sizeof(double)*np);
    mlapl  = (double *) libxc_malloc(2*sizeof(double)*np);
    mtau   = (double *) libxc_malloc(2*sizeof(double)*np);

    xc_mgga_vars_allocate_all(func->func_aux[1]->info->family, np, &(func->func_aux[1]->dim),
                         order >= 0, order >= 1, order >= 2, order >= 3, order >= 4,
                         &ked2_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ked2_));
  }

  /* evaluate the kinetic energy functional */
  if(func->nspin == XC_UNPOLARIZED){
    xc_mgga_evaluate_functional(func->func_aux[1], np, rho, sigma, lapl, NULL,
                           ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, ked1_));
  }else{
    for(ii=0; ii<np; ii++){
      mrho  [2*ii] = rho  [2*ii]; mrho  [2*ii+1] = 0.0;
      msigma[3*ii] = sigma[3*ii]; msigma[3*ii+1] = 0.0; msigma[3*ii+2] = 0.0;
      mlapl [2*ii] = lapl [2*ii]; mlapl [2*ii+1] = 0.0;
    }
    xc_mgga_evaluate_functional(func->func_aux[1], np, mrho, msigma, mlapl, NULL,
                           ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, ked1_));

    for(ii=0; ii<np; ii++){
      mrho  [2*ii] = rho  [2*ii + 1];
      msigma[3*ii] = sigma[3*ii + 2];
      mlapl [2*ii] = lapl [2*ii + 1];
    }
    xc_mgga_evaluate_functional(func->func_aux[1], np, mrho, msigma, mlapl, NULL,
                           ked2_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, ked2_));

  }

  /* now evaluate the mgga functional */
  if(func->nspin == XC_UNPOLARIZED){
    for(ii=0; ii<np; ii++){
      mtau[ii] = rho[ii]*ked1_zk[ii];
    }
  }else{
    for(ii=0; ii<np; ii++){
      mtau[2*ii    ] = rho[2*ii    ]*ked1_zk[ii];
      mtau[2*ii + 1] = rho[2*ii + 1]*ked2_zk[ii];
    }
  }
  xc_mgga_evaluate_functional(func->func_aux[0], np, rho, sigma, lapl, mtau,
                         mgga_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, mgga_));

  /* now we have to combine the results */
  for(ii=0; ii<np; ii++){
    if(zk != NULL){
      *zk = *mgga_zk;
    }

#ifndef XC_DONT_COMPILE_VXC
    if(vrho != NULL){
#include "maple2c/deorbitalize_1.c"
    }
#ifndef XC_DONT_COMPILE_FXC
    if(v2rho2 != NULL){
#include "maple2c/deorbitalize_2.c"
    }
#ifndef XC_DONT_COMPILE_KXC
    if(v3rho3 != NULL){
#include "maple2c/deorbitalize_3.c"
    }
#ifndef XC_DONT_COMPILE_LXC
    if(v4rho4 != NULL){
#include "maple2c/deorbitalize_4.c"
    }
#endif
#endif
#endif
#endif

    internal_counters_mgga_next(&(func->dim), 0, &null, &null, &null, &null,
                                &zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ));
    internal_counters_mgga_next(&(func->func_aux[0]->dim), 0, &null, &null, &null, &null,
                                &mgga_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, mgga_));
    internal_counters_mgga_next(&(func->func_aux[1]->dim), 0, &null, &null, &null, &null,
                                &ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ked1_));
    if(func->nspin == XC_POLARIZED){
      internal_counters_mgga_next(&(func->func_aux[1]->dim), 0, &null, &null, &null, &null,
                                  &ked2_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ked2_));
    }
  }

  /* move the counters back to zero and deallocate the memory */
  internal_counters_mgga_random(&(func->func_aux[0]->dim), -np, 0, &null, &null, &null, &null,
                                &mgga_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, mgga_));
  xc_mgga_vars_free_all(mgga_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, mgga_));

  internal_counters_mgga_random(&(func->func_aux[1]->dim), -np, 0, &null, &null, &null, &null,
                                &ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ked1_));
  xc_mgga_vars_free_all(ked1_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, ked1_));
  if(func->nspin == XC_POLARIZED){
    internal_counters_mgga_random(&(func->func_aux[1]->dim), -np, 0, &null, &null, &null, &null,
                                  &ked2_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, ked2_));
    xc_mgga_vars_free_all(ked2_zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, ked2_));

    free(mrho); free(msigma); free(mlapl);
  }
  free(mtau);
}